

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdInitializeMultisigSign(void *handle,void **multisign_handle)

{
  void *pvVar1;
  CfdException *this;
  allocator local_49;
  undefined1 local_48 [32];
  
  cfd::Initialize();
  if (multisign_handle != (void **)0x0) {
    std::__cxx11::string::string((string *)local_48,"MultisigSign",&local_49);
    pvVar1 = cfd::capi::AllocBuffer((string *)local_48,0x15cc);
    *multisign_handle = pvVar1;
    std::__cxx11::string::~string((string *)local_48);
    return 0;
  }
  local_48._0_8_ = "cfdcapi_transaction.cpp";
  local_48._8_4_ = 0x761;
  local_48._16_8_ = "CfdInitializeMultisigSign";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"multisig sign handle is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_48,"Failed to parameter. multisig sign handle is null.",&local_49);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeMultisigSign(void* handle, void** multisign_handle) {
  try {
    cfd::Initialize();
    if (multisign_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "multisig sign handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. multisig sign handle is null.");
    }

    *multisign_handle =
        AllocBuffer(kPrefixMultisigSignData, sizeof(CfdCapiMultisigSignData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}